

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_t * matd_select(matd_t *a,int r0,int r1,int c0,int c1)

{
  matd_t *pmVar1;
  int iVar2;
  int iVar3;
  int row;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xa8,"matd_t *matd_select(const matd_t *, int, int, int, int)");
  }
  if ((-1 < r0) && ((uint)r0 < a->nrows)) {
    if ((-1 < c0) && ((uint)c0 < a->ncols)) {
      pmVar1 = matd_create((r1 - r0) + 1,(c1 - c0) + 1);
      iVar2 = 0;
      for (; r0 <= r1; r0 = r0 + 1) {
        for (iVar3 = 0; c0 + iVar3 <= c1; iVar3 = iVar3 + 1) {
          pmVar1[(ulong)(pmVar1->ncols * iVar2 + iVar3) + 1] =
               a[(ulong)(c0 + iVar3 + a->ncols * r0) + 1];
        }
        iVar2 = iVar2 + 1;
      }
      return pmVar1;
    }
    __assert_fail("c0 >= 0 && c0 < a->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xab,"matd_t *matd_select(const matd_t *, int, int, int, int)");
  }
  __assert_fail("r0 >= 0 && r0 < a->nrows",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0xaa,"matd_t *matd_select(const matd_t *, int, int, int, int)");
}

Assistant:

matd_t *matd_select(const matd_t * a, int r0, int r1, int c0, int c1)
{
    assert(a != NULL);

    assert(r0 >= 0 && r0 < a->nrows);
    assert(c0 >= 0 && c0 < a->ncols);

    int nrows = r1 - r0 + 1;
    int ncols = c1 - c0 + 1;

    matd_t * r = matd_create(nrows, ncols);

    for (int row = r0; row <= r1; row++)
        for (int col = c0; col <= c1; col++)
            MATD_EL(r,row-r0,col-c0) = MATD_EL(a,row,col);

    return r;
}